

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

SVectorBase<double> * __thiscall
soplex::SVSetBase<double>::create(SVSetBase<double> *this,int idxmax)

{
  int iVar1;
  DLPSV *pDVar2;
  int in_ESI;
  SVSetBase<double> *in_RDI;
  bool in_stack_0000001b;
  int in_stack_0000001c;
  DLPSV *ps;
  int in_stack_ffffffffffffffcc;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *in_stack_ffffffffffffffd0;
  DLPSV *elmem;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 local_c;
  
  local_c = in_ESI;
  if (in_ESI < 0) {
    local_c = 0;
  }
  iVar1 = memSize((SVSetBase<double> *)0x26bc50);
  if ((iVar1 == 0) && (local_c < 1)) {
    local_c = 1;
  }
  ensureMem((SVSetBase<double> *)ps,in_stack_0000001c,in_stack_0000001b);
  memSize((SVSetBase<double> *)0x26bc81);
  ClassArray<soplex::Nonzero<double>_>::reSize
            ((ClassArray<soplex::Nonzero<double>_> *)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  ensurePSVec(in_RDI,in_stack_ffffffffffffffdc);
  pDVar2 = ClassSet<soplex::SVSetBase<double>::DLPSV>::create(in_stack_ffffffffffffffd0);
  IdList<soplex::SVSetBase<double>::DLPSV>::append
            ((IdList<soplex::SVSetBase<double>::DLPSV> *)in_RDI,
             (DLPSV *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  elmem = pDVar2;
  ClassArray<soplex::Nonzero<double>_>::last(&in_RDI->super_ClassArray<soplex::Nonzero<double>_>);
  SVectorBase<double>::setMem((SVectorBase<double> *)in_RDI,local_c,(Nonzero<double> *)elmem);
  return &pDVar2->super_SVectorBase<double>;
}

Assistant:

SVectorBase<R>* create(int idxmax = 0)
   {
      DLPSV* ps;

      if(idxmax < 0)
         idxmax = 0;

      if(memSize() == 0 && idxmax <= 0)
         idxmax = 1;

      ensureMem(idxmax);

      // resize the data array
#ifndef NDEBUG
      Nonzero<R>* olddata = SVSetBaseArray::data;
      SVSetBaseArray::reSize(memSize() + idxmax);
      assert(olddata == SVSetBaseArray::data);
#else
      SVSetBaseArray::reSize(memSize() + idxmax);
#endif

      ensurePSVec(1);
      ps = set.create();
      list.append(ps);

      ps->setMem(idxmax, &SVSetBaseArray::last() - idxmax + 1);

      return ps;
   }